

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pingpong.c
# Opt level: O0

CURLcode Curl_pp_flushsend(Curl_easy *data,pingpong *pp)

{
  size_t sVar1;
  _Bool _Var2;
  curltime cVar3;
  undefined4 uStack_34;
  CURLcode local_2c;
  size_t sStack_28;
  CURLcode result;
  size_t written;
  pingpong *pp_local;
  Curl_easy *data_local;
  
  written = (size_t)pp;
  pp_local = (pingpong *)data;
  _Var2 = Curl_pp_needs_flush(data,pp);
  if (_Var2) {
    local_2c = Curl_conn_send((Curl_easy *)pp_local,0,
                              (void *)((*(long *)(written + 0x10) + *(long *)(written + 0x20)) -
                                      *(long *)(written + 0x18)),*(size_t *)(written + 0x18),false,
                              &stack0xffffffffffffffd8);
    sVar1 = written;
    if (local_2c == CURLE_AGAIN) {
      local_2c = CURLE_OK;
      sStack_28 = 0;
    }
    if (local_2c == CURLE_OK) {
      if (sStack_28 == *(size_t *)(written + 0x18)) {
        *(undefined8 *)(written + 0x10) = 0;
        *(undefined8 *)(written + 0x20) = 0;
        *(undefined8 *)(written + 0x18) = 0;
        cVar3 = Curl_now();
        *(time_t *)(sVar1 + 0x28) = cVar3.tv_sec;
        *(ulong *)(sVar1 + 0x30) = CONCAT44(uStack_34,cVar3.tv_usec);
      }
      else {
        *(size_t *)(written + 0x18) = *(long *)(written + 0x18) - sStack_28;
      }
      data_local._4_4_ = CURLE_OK;
    }
    else {
      data_local._4_4_ = local_2c;
    }
  }
  else {
    data_local._4_4_ = CURLE_OK;
  }
  return data_local._4_4_;
}

Assistant:

CURLcode Curl_pp_flushsend(struct Curl_easy *data,
                           struct pingpong *pp)
{
  /* we have a piece of a command still left to send */
  size_t written;
  CURLcode result;

  if(!Curl_pp_needs_flush(data, pp))
    return CURLE_OK;

  result = Curl_conn_send(data, FIRSTSOCKET,
                          pp->sendthis + pp->sendsize - pp->sendleft,
                          pp->sendleft, FALSE, &written);
  if(result == CURLE_AGAIN) {
    result = CURLE_OK;
    written = 0;
  }
  if(result)
    return result;

  if(written != pp->sendleft) {
    /* only a fraction was sent */
    pp->sendleft -= written;
  }
  else {
    pp->sendthis = NULL;
    pp->sendleft = pp->sendsize = 0;
    pp->response = Curl_now();
  }
  return CURLE_OK;
}